

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

Vec_Wec_t * Abc_GraphFrontiers(Vec_Int_t *vEdges,Vec_Int_t *vLife)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  Vec_Int_t *p_00;
  int iVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  
  iVar9 = vEdges->nSize / 2;
  p = (Vec_Wec_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar4 = (Vec_Int_t *)calloc((long)iVar7,0x10);
  }
  p->pArray = pVVar4;
  iVar9 = vLife->nSize / 2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  pVVar4->pArray = piVar5;
  Vec_WecPushLevel(p);
  iVar7 = vEdges->nSize;
  if (1 < iVar7) {
    uVar8 = 0;
    do {
      if ((long)iVar7 <= (long)(uVar8 * 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar5 = vEdges->pArray;
      lVar6 = 0;
      bVar11 = true;
      do {
        bVar10 = bVar11;
        iVar7 = piVar5[uVar8 * 2 + lVar6];
        if (iVar7 < 0) {
LAB_0048f113:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar3 = iVar7 * 2;
        uVar1 = vLife->nSize;
        if (uVar1 == uVar3 || SBORROW4(uVar1,uVar3) != (int)(uVar1 + iVar7 * -2) < 0)
        goto LAB_0048f113;
        if (uVar8 == (uint)vLife->pArray[uVar3]) {
          Vec_IntPush(pVVar4,iVar7);
        }
        else {
          if (uVar1 <= (uVar3 | 1)) goto LAB_0048f113;
          if (uVar8 == (uint)vLife->pArray[uVar3 | 1]) {
            iVar9 = pVVar4->nSize;
            if (0 < (long)iVar9) {
              piVar2 = pVVar4->pArray;
              lVar6 = 1;
LAB_0048f035:
              if (piVar2[lVar6 + -1] != iVar7) goto code_r0x0048f03b;
              if ((int)lVar6 < iVar9) {
                lVar6 = lVar6 + -1;
                do {
                  piVar2[lVar6] = piVar2[lVar6 + 1];
                  lVar6 = lVar6 + 1;
                } while (iVar9 + -1 != lVar6);
              }
              pVVar4->nSize = iVar9 + -1;
              goto LAB_0048f076;
            }
            if (iVar9 != 0) {
              __assert_fail("i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
            }
          }
        }
LAB_0048f076:
        lVar6 = 1;
        bVar11 = false;
      } while (bVar10);
      p_00 = Vec_WecPushLevel(p);
      iVar7 = pVVar4->nSize;
      if (0 < (long)iVar7) {
        piVar5 = pVVar4->pArray;
        lVar6 = 0;
        do {
          Vec_IntPush(p_00,piVar5[lVar6]);
          lVar6 = lVar6 + 1;
        } while (iVar7 != lVar6);
      }
      uVar8 = uVar8 + 1;
      iVar7 = vEdges->nSize;
    } while ((long)uVar8 < (long)(iVar7 / 2));
    piVar5 = pVVar4->pArray;
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar4);
  return p;
code_r0x0048f03b:
  bVar11 = lVar6 == iVar9;
  lVar6 = lVar6 + 1;
  if (bVar11) goto LAB_0048f076;
  goto LAB_0048f035;
}

Assistant:

Vec_Wec_t * Abc_GraphFrontiers( Vec_Int_t * vEdges, Vec_Int_t * vLife )
{
    Vec_Wec_t * vFronts = Vec_WecAlloc( Vec_IntSize(vEdges)/2 ); // front for each edge
    Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vLife)/2 );
    int e, n;    
    Vec_WecPushLevel(vFronts);
    for ( e = 0; e < Vec_IntSize(vEdges)/2; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        for ( n = 0; n < 2; n++ )
            if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
                Vec_IntPush( vTemp, pNodes[n] );
            else if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
                Vec_IntRemove( vTemp, pNodes[n] );
        Vec_IntAppend( Vec_WecPushLevel(vFronts), vTemp );
    }
    //Vec_WecPrint( vFronts, 0 );
    Vec_IntFree( vTemp );
    return vFronts;
}